

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O2

void __thiscall cmCursesLongMessageForm::UpdateStatusBar(cmCursesLongMessageForm *this)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  size_t i;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  char fmt_s [3];
  char vertmp [128];
  char version [512];
  char bar [512];
  
  if (_stdscr == 0) {
    iVar5 = -1;
    iVar8 = iVar5;
  }
  else {
    iVar5 = *(short *)(_stdscr + 6) + 1;
    iVar8 = *(short *)(_stdscr + 4) + 1;
  }
  pcVar3 = (this->Title)._M_dataplus._M_p;
  sVar2 = strlen(pcVar3);
  sVar4 = 0x1ff;
  if (sVar2 < 0x1ff) {
    sVar4 = sVar2;
  }
  strncpy(bar,pcVar3,sVar4);
  for (uVar9 = sVar4 - 1; uVar9 < 0x200; uVar9 = uVar9 + 1) {
    bar[uVar9] = ' ';
  }
  iVar1 = 0x1ff;
  if (iVar5 < 0x1ff) {
    iVar1 = iVar5;
  }
  lVar7 = (long)iVar1;
  bar[lVar7] = '\0';
  pcVar3 = cmVersion::GetCMakeVersion();
  sprintf(vertmp,"CMake Version %s",pcVar3);
  sVar4 = strlen(vertmp);
  for (lVar6 = 0; lVar7 - sVar4 != lVar6; lVar6 = lVar6 + 1) {
    version[lVar6] = ' ';
  }
  strcpy(version + (lVar7 - sVar4),vertmp);
  version[lVar7] = '\0';
  fmt_s[2] = '\0';
  fmt_s[0] = '%';
  fmt_s[1] = 's';
  move(iVar8 + -4,0);
  wattr_on(_stdscr,0x10000,0);
  printw(fmt_s,bar);
  wattr_off(_stdscr,0x10000,0);
  move(iVar8 + -3,0);
  printw(fmt_s,version);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesLongMessageForm::UpdateStatusBar()
{
  int x,y;
  getmaxyx(stdscr, y, x);

  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t size = strlen(this->Title.c_str());
  if ( size >= cmCursesMainForm::MAX_WIDTH )
    {
    size = cmCursesMainForm::MAX_WIDTH-1;
    }
  strncpy(bar, this->Title.c_str(), size);
  for(size_t i=size-1; i<cmCursesMainForm::MAX_WIDTH; i++) bar[i] = ' ';

  int width;
  if (x < cmCursesMainForm::MAX_WIDTH )
    {
    width = x;
    }
  else
    {
    width = cmCursesMainForm::MAX_WIDTH-1;
    }

  bar[width] = '\0';

  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp,"CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width-strlen(vertmp));
  for(size_t i=0; i<sideSpace; i++) { version[i] = ' '; }
  sprintf(version+sideSpace, "%s", vertmp);
  version[width] = '\0';

  char fmt_s[] = "%s";
  curses_move(y-4,0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y-3,0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}